

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_schnorrsig_verify
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_xonly_pubkey *pubkey)

{
  int iVar1;
  int overflow;
  secp256k1_ge r;
  secp256k1_scalar s;
  uchar buf [32];
  secp256k1_scalar e;
  secp256k1_fe rx;
  secp256k1_ge pk;
  secp256k1_gej pkj;
  secp256k1_gej rj;
  int local_2a4;
  secp256k1_ge local_2a0;
  secp256k1_scalar local_248;
  uchar local_228 [40];
  secp256k1_scalar local_200;
  secp256k1_fe local_1e0;
  secp256k1_fe local_1b8;
  secp256k1_ge local_190;
  secp256k1_gej local_138;
  secp256k1_gej local_b0;
  
  if (sig64 == (uchar *)0x0) {
    secp256k1_schnorrsig_verify_cold_3();
  }
  else if (msglen == 0 || msg != (uchar *)0x0) {
    if (pubkey == (secp256k1_xonly_pubkey *)0x0) {
      secp256k1_schnorrsig_verify_cold_1();
    }
    else {
      secp256k1_fe_impl_set_b32_mod(&local_1e0,sig64);
      if (((0xffffefffffc2e < local_1e0.n[0]) && (local_1e0.n[4] == 0xffffffffffff)) &&
         ((local_1e0.n[2] & local_1e0.n[3] & local_1e0.n[1]) == 0xfffffffffffff)) {
        return 0;
      }
      secp256k1_scalar_set_b32(&local_248,sig64 + 0x20,&local_2a4);
      if ((local_2a4 == 0) &&
         (iVar1 = secp256k1_pubkey_load(ctx,&local_190,(secp256k1_pubkey *)pubkey), iVar1 != 0)) {
        secp256k1_fe_impl_get_b32(local_228,&local_190.x);
        secp256k1_schnorrsig_challenge(&local_200,sig64,msg,msglen,local_228);
        secp256k1_scalar_negate(&local_200,&local_200);
        local_138.infinity = local_190.infinity;
        local_138.x.n[0] = local_190.x.n[0];
        local_138.x.n[1] = local_190.x.n[1];
        local_138.x.n[2] = local_190.x.n[2];
        local_138.x.n[3] = local_190.x.n[3];
        local_138.x.n[4] = local_190.x.n[4];
        local_138.y.n[0] = local_190.y.n[0];
        local_138.y.n[1] = local_190.y.n[1];
        local_138.y.n[2] = local_190.y.n[2];
        local_138.y.n[3] = local_190.y.n[3];
        local_138.y.n[4] = local_190.y.n[4];
        local_138.z.n[0] = 1;
        local_138.z.n[1] = 0;
        local_138.z.n[2] = 0;
        local_138.z.n[3] = 0;
        local_138.z.n[4] = 0;
        secp256k1_ecmult(&local_b0,&local_138,&local_200,&local_248);
        secp256k1_ge_set_gej_var(&local_2a0,&local_b0);
        if (local_2a0.infinity == 0) {
          secp256k1_fe_impl_normalize_var(&local_2a0.y);
          if (((byte)local_2a0.y.n[0] & 1) != 0) {
            return 0;
          }
          local_1b8.n[0] = (local_2a0.x.n[0] - local_1e0.n[0]) + 0x3ffffbfffff0bc;
          local_1b8.n[1] = (0x3ffffffffffffc - local_1e0.n[1]) + local_2a0.x.n[1];
          local_1b8.n[2] = (0x3ffffffffffffc - local_1e0.n[2]) + local_2a0.x.n[2];
          local_1b8.n[3] = (0x3ffffffffffffc - local_1e0.n[3]) + local_2a0.x.n[3];
          local_1b8.n[4] = (local_2a0.x.n[4] - local_1e0.n[4]) + 0x3fffffffffffc;
          iVar1 = secp256k1_fe_impl_normalizes_to_zero(&local_1b8);
          return iVar1;
        }
      }
    }
  }
  else {
    secp256k1_schnorrsig_verify_cold_2();
  }
  return 0;
}

Assistant:

int secp256k1_schnorrsig_verify(const secp256k1_context* ctx, const unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_xonly_pubkey *pubkey) {
    secp256k1_scalar s;
    secp256k1_scalar e;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_gej pkj;
    secp256k1_fe rx;
    secp256k1_ge r;
    unsigned char buf[32];
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_fe_set_b32_limit(&rx, &sig64[0])) {
        return 0;
    }

    secp256k1_scalar_set_b32(&s, &sig64[32], &overflow);
    if (overflow) {
        return 0;
    }

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }

    /* Compute e. */
    secp256k1_fe_get_b32(buf, &pk.x);
    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, buf);

    /* Compute rj =  s*G + (-e)*pkj */
    secp256k1_scalar_negate(&e, &e);
    secp256k1_gej_set_ge(&pkj, &pk);
    secp256k1_ecmult(&rj, &pkj, &e, &s);

    secp256k1_ge_set_gej_var(&r, &rj);
    if (secp256k1_ge_is_infinity(&r)) {
        return 0;
    }

    secp256k1_fe_normalize_var(&r.y);
    return !secp256k1_fe_is_odd(&r.y) &&
           secp256k1_fe_equal(&rx, &r.x);
}